

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SolitaireTests.cpp
# Opt level: O2

void __thiscall
solitaire::SolitaireHandWithTwoCardsTest_tryAddCardOnTableauPileWithFail_Test::TestBody
          (SolitaireHandWithTwoCardsTest_tryAddCardOnTableauPileWithFail_Test *this)

{
  TableauPileMock *this_00;
  vector<solitaire::cards::Card,_std::allocator<solitaire::cards::Card>_> *rhs;
  PolymorphicMatcher<testing::internal::ContainerEqMatcher<std::vector<solitaire::cards::Card,_std::allocator<solitaire::cards::Card>_>_>_>
  *matcher;
  Solitaire *this_01;
  undefined1 *this_02;
  char *message;
  AssertHelper AStack_88;
  MockSpec<void_(std::vector<solitaire::cards::Card,_std::allocator<solitaire::cards::Card>_>_&)>
  local_80;
  AssertionResult gtest_ar;
  PileId local_44;
  _Vector_base<solitaire::cards::Card,_std::allocator<solitaire::cards::Card>_> local_40;
  Cards cardsToAdd;
  
  this_02 = (anonymous_namespace)::twoCards;
  std::vector<solitaire::cards::Card,_std::allocator<solitaire::cards::Card>_>::vector
            (&cardsToAdd,
             (vector<solitaire::cards::Card,_std::allocator<solitaire::cards::Card>_> *)
             (anonymous_namespace)::twoCards);
  local_80.function_mocker_ =
       (FunctionMocker<void_(std::vector<solitaire::cards::Card,_std::allocator<solitaire::cards::Card>_>_&)>
        *)piles::TableauPileMock::gmock_createSnapshot
                    ((MockSpec<std::unique_ptr<solitaire::archivers::interfaces::Snapshot,_std::default_delete<solitaire::archivers::interfaces::Snapshot>_>_()>
                      *)(this->super_SolitaireHandWithTwoCardsTest).super_SolitaireEmptyHandTest.
                        super_SolitaireTest.lastTableauPileMock,(TableauPileMock *)this_02);
  testing::internal::GetWithoutMatchers();
  testing::internal::
  MockSpec<std::unique_ptr<solitaire::archivers::interfaces::Snapshot,_std::default_delete<solitaire::archivers::interfaces::Snapshot>_>_()>
  ::InternalExpectedAt
            ((MockSpec<std::unique_ptr<solitaire::archivers::interfaces::Snapshot,_std::default_delete<solitaire::archivers::interfaces::Snapshot>_>_()>
              *)&local_80,
             "/workspace/llm4binary/github/license_all_cmakelists_25/smarkuck[P]Solitaire-written-using-TDD-approach/SolitaireLib/unitTests/sources/SolitaireTests.cpp"
             ,0x211,"lastTableauPileMock","createSnapshot()");
  this_00 = (this->super_SolitaireHandWithTwoCardsTest).super_SolitaireEmptyHandTest.
            super_SolitaireTest.lastTableauPileMock;
  testing::Matcher<std::vector<solitaire::cards::Card,_std::allocator<solitaire::cards::Card>_>_&>::
  Matcher((Matcher<std::vector<solitaire::cards::Card,_std::allocator<solitaire::cards::Card>_>_&> *
          )&gtest_ar,&cardsToAdd);
  piles::TableauPileMock::gmock_tryAddCards
            (&local_80,this_00,
             (Matcher<std::vector<solitaire::cards::Card,_std::allocator<solitaire::cards::Card>_>_&>
              *)&gtest_ar);
  testing::internal::GetWithoutMatchers();
  testing::internal::
  MockSpec<void_(std::vector<solitaire::cards::Card,_std::allocator<solitaire::cards::Card>_>_&)>::
  InternalExpectedAt(&local_80,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/smarkuck[P]Solitaire-written-using-TDD-approach/SolitaireLib/unitTests/sources/SolitaireTests.cpp"
                     ,0x212,"lastTableauPileMock","tryAddCards(cardsToAdd)");
  testing::internal::
  MatcherBase<std::vector<solitaire::cards::Card,_std::allocator<solitaire::cards::Card>_>_&>::
  ~MatcherBase((MatcherBase<std::vector<solitaire::cards::Card,_std::allocator<solitaire::cards::Card>_>_&>
                *)&local_80.matchers_);
  testing::internal::
  MatcherBase<std::vector<solitaire::cards::Card,_std::allocator<solitaire::cards::Card>_>_&>::
  ~MatcherBase((MatcherBase<std::vector<solitaire::cards::Card,_std::allocator<solitaire::cards::Card>_>_&>
                *)&gtest_ar);
  this_01 = &(this->super_SolitaireHandWithTwoCardsTest).super_SolitaireEmptyHandTest.
             super_SolitaireTest.solitaire;
  local_44.t = (anonymous_namespace)::lastTableauPileId;
  Solitaire::tryAddCardsOnTableauPile(this_01,&local_44);
  testing::ContainerEq<std::vector<solitaire::cards::Card,std::allocator<solitaire::cards::Card>>>
            ((PolymorphicMatcher<testing::internal::ContainerEqMatcher<std::vector<solitaire::cards::Card,_std::allocator<solitaire::cards::Card>_>_>_>
              *)&local_40,(testing *)(anonymous_namespace)::twoCards,rhs);
  testing::internal::
  MakePredicateFormatterFromMatcher<testing::PolymorphicMatcher<testing::internal::ContainerEqMatcher<std::vector<solitaire::cards::Card,std::allocator<solitaire::cards::Card>>>>>
            ((PredicateFormatterFromMatcher<testing::PolymorphicMatcher<testing::internal::ContainerEqMatcher<std::vector<solitaire::cards::Card,_std::allocator<solitaire::cards::Card>_>_>_>_>
              *)&local_80,(internal *)&local_40,matcher);
  Solitaire::getCardsInHand(this_01);
  testing::internal::
  PredicateFormatterFromMatcher<testing::PolymorphicMatcher<testing::internal::ContainerEqMatcher<std::vector<solitaire::cards::Card,std::allocator<solitaire::cards::Card>>>>>
  ::operator()(&gtest_ar,(char *)&local_80,
               (vector<solitaire::cards::Card,_std::allocator<solitaire::cards::Card>_> *)
               "solitaire.getCardsInHand()");
  std::_Vector_base<solitaire::cards::Card,_std::allocator<solitaire::cards::Card>_>::~_Vector_base
            ((_Vector_base<solitaire::cards::Card,_std::allocator<solitaire::cards::Card>_> *)
             &local_80);
  std::_Vector_base<solitaire::cards::Card,_std::allocator<solitaire::cards::Card>_>::~_Vector_base
            (&local_40);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&local_80);
    if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )gtest_ar.message_._M_t.
          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
          ._M_head_impl ==
        (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )0x0) {
      message = "";
    }
    else {
      message = *(char **)gtest_ar.message_._M_t.
                          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_t.
                          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          .
                          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                          ._M_head_impl;
    }
    testing::internal::AssertHelper::AssertHelper
              (&AStack_88,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/smarkuck[P]Solitaire-written-using-TDD-approach/SolitaireLib/unitTests/sources/SolitaireTests.cpp"
               ,0x215,message);
    testing::internal::AssertHelper::operator=(&AStack_88,(Message *)&local_80);
    testing::internal::AssertHelper::~AssertHelper(&AStack_88);
    if (local_80.function_mocker_ !=
        (FunctionMocker<void_(std::vector<solitaire::cards::Card,_std::allocator<solitaire::cards::Card>_>_&)>
         *)0x0) {
      (*(code *)(((FunctionMocker<std::unique_ptr<solitaire::archivers::interfaces::Snapshot,_std::default_delete<solitaire::archivers::interfaces::Snapshot>_>_()>
                   *)((local_80.function_mocker_)->super_UntypedFunctionMockerBase).
                     _vptr_UntypedFunctionMockerBase)->super_UntypedFunctionMockerBase).mock_obj_)()
      ;
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr(&gtest_ar.message_);
  std::_Vector_base<solitaire::cards::Card,_std::allocator<solitaire::cards::Card>_>::~_Vector_base
            (&cardsToAdd.
              super__Vector_base<solitaire::cards::Card,_std::allocator<solitaire::cards::Card>_>);
  return;
}

Assistant:

TEST_F(SolitaireHandWithTwoCardsTest, tryAddCardOnTableauPileWithFail) {
    auto cardsToAdd {twoCards};

    EXPECT_CALL(lastTableauPileMock, createSnapshot());
    EXPECT_CALL(lastTableauPileMock, tryAddCards(cardsToAdd));

    solitaire.tryAddCardsOnTableauPile(lastTableauPileId);
    EXPECT_THAT(solitaire.getCardsInHand(), ContainerEq(twoCards));
}